

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,-1,0,3,-1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,_1,0,3,_1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  float *pfVar1;
  size_type sVar2;
  float fVar3;
  size_type i;
  undefined8 *puVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __nth;
  node_type *pnVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  long lVar9;
  int depth_00;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,_1,0,3,_1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
  *pbVar10;
  ulong uVar11;
  node_type *pnVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:261:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:271:11)>
  __comp_00;
  size_type split_dim;
  scalar_type split_val;
  box_type right;
  size_type local_68;
  float local_60;
  index_type local_5c;
  undefined1 local_58 [12];
  float fStack_4c;
  float *local_48;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,_1,0,3,_1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
  *local_38;
  
  lVar6 = *(long *)(this + 0x20);
  lVar7 = *(long *)(lVar6 + 0x10);
  local_5c = depth;
  if (lVar7 == 0x100) {
    puVar4 = (undefined8 *)operator_new(0x2008);
    *puVar4 = *(undefined8 *)(lVar6 + 8);
    *(undefined8 **)(lVar6 + 8) = puVar4;
    puVar4 = puVar4 + 1;
    *(undefined8 **)(lVar6 + 0x18) = puVar4;
    lVar7 = 0;
  }
  else {
    puVar4 = *(undefined8 **)(lVar6 + 0x18);
  }
  pnVar12 = (node_type *)(puVar4 + lVar7 * 4);
  *(long *)(lVar6 + 0x10) = lVar7 + 1;
  uVar11 = (long)end._M_current - (long)begin._M_current >> 2;
  local_68 = (size_type)*(int *)(this + 8);
  if ((long)uVar11 <= (long)local_68) {
    lVar6 = **(long **)(this + 0x18);
    (pnVar12->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar6) >> 2);
    (pnVar12->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar6) >> 2);
    (pnVar12->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    left = (kd_tree_node_euclidean<int,_float> *)0x0;
    (pnVar12->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    right = (kd_tree_node_euclidean<int,_float> *)0x0;
    lVar6 = -0xc;
    do {
      *(undefined4 *)((long)(box->storage_).coords_max._M_elems + lVar6) = 0x7f7fffff;
      *(undefined4 *)((long)box[1].storage_.coords_min._M_elems + lVar6) = 0xff7fffff;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0);
    if (end._M_current <= begin._M_current) {
      return pnVar12;
    }
    lVar6 = *(long *)**(undefined8 **)this;
    do {
      lVar7 = lVar6 + (long)*begin._M_current * 0xc;
      lVar9 = 0;
      do {
        fVar13 = *(float *)(lVar7 + lVar9 * 4);
        if (fVar13 < (box->storage_).coords_min._M_elems[lVar9]) {
          (box->storage_).coords_min._M_elems[lVar9] = fVar13;
          fVar13 = *(float *)(lVar7 + lVar9 * 4);
        }
        pfVar1 = (box->storage_).coords_max._M_elems + lVar9;
        if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) {
          (box->storage_).coords_max._M_elems[lVar9] = fVar13;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current < end._M_current);
    return pnVar12;
  }
  fVar13 = -3.4028235e+38;
  sVar8 = 0;
  fVar14 = -3.4028235e+38;
  do {
    fVar15 = (box->storage_).coords_max._M_elems[sVar8] - (box->storage_).coords_min._M_elems[sVar8]
    ;
    sVar2 = sVar8;
    fVar3 = fVar15;
    if (fVar15 <= fVar14) {
      fVar15 = fVar14;
      sVar2 = local_68;
      fVar3 = fVar13;
    }
    fVar13 = fVar3;
    local_68 = sVar2;
    fVar14 = fVar15;
    sVar8 = sVar8 + 1;
  } while (sVar8 != 3);
  pbVar10 = this + 0x10;
  unique0x00004e80 = &local_68;
  local_60 = fVar13 * 0.5 + (box->storage_).coords_min._M_elems[local_68];
  local_48 = &local_60;
  local_58._0_8_ = pbVar10;
  local_38 = this;
  __nth = std::operator()(begin._M_current,end._M_current);
  if (__nth._M_current == end._M_current) {
    __nth._M_current = __nth._M_current + -1;
    if (begin._M_current != end._M_current) {
      lVar6 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp._M_comp.split_dim = &local_68;
      __comp._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
            *)pbVar10;
      std::operator()(begin,__nth,end,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp);
    }
  }
  else {
    if (__nth._M_current != begin._M_current) goto LAB_001060d6;
    __nth._M_current = __nth._M_current + 1;
    if (__nth._M_current != end._M_current && begin._M_current != end._M_current) {
      lVar6 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      __comp_00._M_comp.split_dim = &local_68;
      __comp_00._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
            *)pbVar10;
      std::operator()(begin,__nth,end,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
    }
  }
  local_60 = *(float *)((long)*__nth._M_current * 0xc + **(long **)pbVar10 + local_68 * 4);
LAB_001060d6:
  local_48 = *(float **)((box->storage_).coords_max._M_elems + 1);
  local_58._0_8_ = *(undefined8 *)(box->storage_).coords_min._M_elems;
  unique0x10000214 = *(size_type **)((box->storage_).coords_min._M_elems + 2);
  (box->storage_).coords_max._M_elems[local_68] = local_60;
  *(float *)(local_58 + local_68 * 4) = local_60;
  pbVar10 = local_38;
  depth_00 = local_5c + 1;
  pnVar5 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (local_38,depth_00,begin,__nth,box);
  (pnVar12->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left
       = pnVar5;
  pnVar5 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (pbVar10,depth_00,__nth,end,(box_type *)local_58);
  (pnVar12->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).right
       = pnVar5;
  (pnVar12->data).branch.split_dim = (int)local_68;
  (pnVar12->data).branch.left_max = (box->storage_).coords_max._M_elems[local_68];
  (pnVar12->data).branch.right_min = *(float *)(local_58 + local_68 * 4);
  lVar6 = 0;
  do {
    if (*(float *)(local_58 + lVar6 * 4) < (box->storage_).coords_min._M_elems[lVar6]) {
      (box->storage_).coords_min._M_elems[lVar6] = *(float *)(local_58 + lVar6 * 4);
    }
    fVar13 = (&fStack_4c)[lVar6];
    pfVar1 = (box->storage_).coords_max._M_elems + lVar6;
    if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) {
      (box->storage_).coords_max._M_elems[lVar6] = fVar13;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return pnVar12;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }